

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmConditional(LlvmCompilationContext *ctx,ExprConditional *node)

{
  LLVMBuilderRef pLVar1;
  int iVar2;
  LLVMValueRef pLVar3;
  TypeBase *pTVar4;
  LLVMTypeRef pLVar5;
  LLVMValueRef pLVar6;
  LLVMBasicBlockRef pLVar7;
  LLVMBasicBlockRef pLVar8;
  LLVMBasicBlockRef pLVar9;
  LLVMValueRef result;
  LLVMBasicBlockRef exitBlock;
  LLVMBasicBlockRef falseBlock;
  LLVMBasicBlockRef trueBlock;
  LLVMValueRef condition;
  ExprConditional *node_local;
  LlvmCompilationContext *ctx_local;
  
  pLVar3 = CompileLlvm(ctx,node->condition);
  iVar2 = LLVMIntNE;
  pLVar1 = ctx->builder;
  pTVar4 = GetStackType(ctx,node->condition->type);
  pLVar5 = CompileLlvmType(ctx,pTVar4);
  pLVar6 = LLVMConstInt(pLVar5,0,true);
  pLVar3 = LLVMBuildICmp(pLVar1,iVar2,pLVar3,pLVar6,"");
  pLVar7 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"cond_true");
  pLVar8 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"cond_false");
  pLVar9 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"cond_exit");
  pLVar1 = ctx->builder;
  pLVar5 = CompileLlvmType(ctx,(node->super_ExprBase).type);
  pLVar6 = LLVMBuildAlloca(pLVar1,pLVar5,"cond");
  LLVMBuildCondBr(ctx->builder,pLVar3,pLVar7,pLVar8);
  LLVMPositionBuilderAtEnd(ctx->builder,pLVar7);
  pLVar1 = ctx->builder;
  pLVar3 = CompileLlvm(ctx,node->trueBlock);
  pTVar4 = GetStackType(ctx,node->trueBlock->type);
  pLVar3 = ConvertToDataType(ctx,pLVar3,pTVar4,node->trueBlock->type);
  LLVMBuildStore(pLVar1,pLVar3,pLVar6);
  LLVMBuildBr(ctx->builder,pLVar9);
  LLVMPositionBuilderAtEnd(ctx->builder,pLVar8);
  pLVar1 = ctx->builder;
  pLVar3 = CompileLlvm(ctx,node->falseBlock);
  pTVar4 = GetStackType(ctx,node->falseBlock->type);
  pLVar3 = ConvertToDataType(ctx,pLVar3,pTVar4,node->falseBlock->type);
  LLVMBuildStore(pLVar1,pLVar3,pLVar6);
  LLVMBuildBr(ctx->builder,pLVar9);
  LLVMPositionBuilderAtEnd(ctx->builder,pLVar9);
  pLVar3 = LLVMBuildLoad(ctx->builder,pLVar6,"");
  pLVar3 = ConvertToStackType(ctx,pLVar3,(node->super_ExprBase).type);
  pLVar3 = CheckType(ctx,&node->super_ExprBase,pLVar3);
  return pLVar3;
}

Assistant:

LLVMValueRef CompileLlvmConditional(LlvmCompilationContext &ctx, ExprConditional *node)
{
	LLVMValueRef condition = CompileLlvm(ctx, node->condition);

	condition = LLVMBuildICmp(ctx.builder, LLVMIntNE, condition, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->condition->type)), 0, true), "");

	LLVMBasicBlockRef trueBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "cond_true");
	LLVMBasicBlockRef falseBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "cond_false");
	LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "cond_exit");

	LLVMValueRef result = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, node->type), "cond");

	LLVMBuildCondBr(ctx.builder, condition, trueBlock, falseBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, trueBlock);

	LLVMBuildStore(ctx.builder, ConvertToDataType(ctx, CompileLlvm(ctx, node->trueBlock), GetStackType(ctx, node->trueBlock->type), node->trueBlock->type), result);

	LLVMBuildBr(ctx.builder, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, falseBlock);

	LLVMBuildStore(ctx.builder, ConvertToDataType(ctx, CompileLlvm(ctx, node->falseBlock), GetStackType(ctx, node->falseBlock->type), node->falseBlock->type), result);

	LLVMBuildBr(ctx.builder, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

	return CheckType(ctx, node, ConvertToStackType(ctx, LLVMBuildLoad(ctx.builder, result, ""), node->type));
}